

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

unsigned_short tinyexr::reverseLutFromBitmap(uchar *bitmap,unsigned_short *lut)

{
  short sVar1;
  int n;
  int i;
  int k;
  unsigned_short *lut_local;
  uchar *bitmap_local;
  
  k = 0;
  for (i = 0; i < 0x10000; i = i + 1) {
    if ((i == 0) || (((uint)bitmap[i >> 3] & 1 << ((byte)i & 7)) != 0)) {
      lut[k] = (unsigned_short)i;
      k = k + 1;
    }
  }
  sVar1 = (short)k;
  while (k < 0x10000) {
    lut[k] = 0;
    k = k + 1;
  }
  return sVar1 - 1;
}

Assistant:

unsigned short reverseLutFromBitmap(const unsigned char bitmap[BITMAP_SIZE],
                                    unsigned short lut[USHORT_RANGE]) {
  int k = 0;

  for (int i = 0; i < USHORT_RANGE; ++i) {
    if ((i == 0) || (bitmap[i >> 3] & (1 << (i & 7)))) lut[k++] = i;
  }

  int n = k - 1;

  while (k < USHORT_RANGE) lut[k++] = 0;

  return n;  // maximum k where lut[k] is non-zero,
}